

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
stringify<std::set<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>
          (string *__return_storage_ptr__,Detail *this,
          set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
          *e)

{
  _Rb_tree_node_base *p_Var1;
  ReusableStringStream rss;
  ReusableStringStream RStack_68;
  string local_50 [32];
  
  p_Var1 = *(_Rb_tree_node_base **)(this + 0x18);
  ReusableStringStream::ReusableStringStream(&RStack_68);
  std::operator<<(RStack_68.m_oss,"{ ");
  if (p_Var1 != (_Rb_tree_node_base *)(this + 8)) {
    std::__cxx11::string::string(local_50,(string *)unprintableString_abi_cxx11_);
    std::operator<<(RStack_68.m_oss,local_50);
    std::__cxx11::string::~string(local_50);
    while( true ) {
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      if (p_Var1 == (_Rb_tree_node_base *)(this + 8)) break;
      std::operator<<(RStack_68.m_oss,", ");
      std::__cxx11::string::string(local_50,(string *)unprintableString_abi_cxx11_);
      std::operator<<(RStack_68.m_oss,local_50);
      std::__cxx11::string::~string(local_50);
    }
  }
  std::operator<<(RStack_68.m_oss," }");
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&RStack_68);
  ReusableStringStream::~ReusableStringStream(&RStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<typename std::remove_cv<typename std::remove_reference<T>::type>::type>::convert(e);
        }